

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O1

Curl_dns_entry *
dnscache_add_addr(Curl_easy *data,Curl_dnscache *dnscache,Curl_addrinfo *addr,char *hostname,
                 size_t hostlen,int port,_Bool permanent)

{
  uint uVar1;
  Curl_addrinfo **ppCVar2;
  curl_trc_feat *pcVar3;
  undefined8 uVar4;
  CURLcode CVar5;
  undefined8 *puVar6;
  ulong uVar7;
  uchar *rnd;
  size_t sVar8;
  time_t tVar9;
  Curl_dns_entry *pCVar10;
  Curl_addrinfo *pCVar11;
  size_t num;
  uint uVar12;
  ulong uVar13;
  bool bVar14;
  char entry_id [262];
  Curl_addrinfo *local_148;
  char local_138 [264];
  
  uVar13 = *(ulong *)&(data->set).field_0x894;
  sVar8 = hostlen;
  if ((uVar13 >> 0x2e & 1) != 0) {
    uVar12 = 0;
    pCVar11 = addr;
    if (addr != (Curl_addrinfo *)0x0) {
      do {
        ppCVar2 = &pCVar11->ai_next;
        uVar12 = uVar12 + 1;
        pCVar11 = *ppCVar2;
      } while (*ppCVar2 != (Curl_addrinfo *)0x0);
    }
    bVar14 = true;
    local_148 = addr;
    if (1 < (int)uVar12) {
      if ((((uint)uVar13 >> 0x1e & 1) != 0 && data != (Curl_easy *)0x0) &&
         ((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 || (0 < pcVar3->log_level))))
      {
        Curl_infof(data,"Shuffling %i addresses",(ulong)uVar12);
      }
      puVar6 = (undefined8 *)(*Curl_cmalloc)((ulong)uVar12 * 8);
      if (puVar6 == (undefined8 *)0x0) {
        bVar14 = false;
      }
      else {
        *puVar6 = addr;
        uVar13 = 2;
        if (2 < (int)uVar12) {
          uVar13 = (ulong)uVar12;
        }
        uVar7 = 1;
        do {
          puVar6[uVar7] = *(undefined8 *)(puVar6[uVar7 - 1] + 0x28);
          uVar7 = uVar7 + 1;
        } while (uVar13 != uVar7);
        num = (ulong)uVar12 << 2;
        rnd = (uchar *)(*Curl_cmalloc)(num);
        bVar14 = rnd != (uchar *)0x0;
        if (bVar14) {
          CVar5 = Curl_rand_bytes(data,rnd,num);
          if (CVar5 == CURLE_OK) {
            uVar1 = uVar12 - 1;
            uVar7 = (ulong)uVar1;
            do {
              uVar4 = puVar6[(ulong)*(uint *)(rnd + uVar7 * 4) % (ulong)uVar12];
              puVar6[(ulong)*(uint *)(rnd + uVar7 * 4) % (ulong)uVar12] = puVar6[uVar7];
              puVar6[uVar7] = uVar4;
              uVar7 = uVar7 - 1;
              uVar12 = uVar12 - 1;
            } while (1 < (int)uVar12);
            uVar7 = 1;
            do {
              *(undefined8 *)(puVar6[uVar7 - 1] + 0x28) = puVar6[uVar7];
              uVar7 = uVar7 + 1;
            } while (uVar13 != uVar7);
            *(undefined8 *)(puVar6[uVar1] + 0x28) = 0;
            local_148 = (Curl_addrinfo *)*puVar6;
          }
          (*Curl_cfree)(rnd);
        }
        (*Curl_cfree)(puVar6);
      }
    }
    addr = local_148;
    if (!bVar14) goto LAB_00133137;
  }
  if (hostlen == 0) {
    hostlen = strlen(hostname);
  }
  puVar6 = (undefined8 *)(*Curl_ccalloc)(1,hostlen + 0x20);
  local_148 = addr;
  if (puVar6 != (undefined8 *)0x0) {
    sVar8 = create_dnscache_id(hostname,hostlen,port,local_138,sVar8);
    puVar6[2] = 1;
    *puVar6 = addr;
    if (permanent) {
      puVar6[1] = 0;
    }
    else {
      tVar9 = time((time_t *)0x0);
      puVar6[1] = tVar9 + (ulong)(tVar9 == 0);
    }
    *(int *)(puVar6 + 3) = port;
    if (hostlen != 0) {
      memcpy((void *)((long)puVar6 + 0x1c),hostname,hostlen);
    }
    pCVar10 = (Curl_dns_entry *)Curl_hash_add(&dnscache->entries,local_138,sVar8 + 1,puVar6);
    if (pCVar10 == (Curl_dns_entry *)0x0) {
      Curl_freeaddrinfo((Curl_addrinfo *)*puVar6);
      (*Curl_cfree)(puVar6);
      return (Curl_dns_entry *)0x0;
    }
    pCVar10->refcount = pCVar10->refcount + 1;
    return pCVar10;
  }
LAB_00133137:
  Curl_freeaddrinfo(local_148);
  return (Curl_dns_entry *)0x0;
}

Assistant:

static struct Curl_dns_entry *
dnscache_add_addr(struct Curl_easy *data,
                  struct Curl_dnscache *dnscache,
                  struct Curl_addrinfo *addr,
                  const char *hostname,
                  size_t hostlen, /* length or zero */
                  int port,
                  bool permanent)
{
  char entry_id[MAX_HOSTCACHE_LEN];
  size_t entry_len;
  struct Curl_dns_entry *dns;
  struct Curl_dns_entry *dns2;

#ifndef CURL_DISABLE_SHUFFLE_DNS
  /* shuffle addresses if requested */
  if(data->set.dns_shuffle_addresses) {
    CURLcode result = Curl_shuffle_addr(data, &addr);
    if(result) {
      Curl_freeaddrinfo(addr);
      return NULL;
    }
  }
#endif
  if(!hostlen)
    hostlen = strlen(hostname);

  /* Create a new cache entry */
  dns = calloc(1, sizeof(struct Curl_dns_entry) + hostlen);
  if(!dns) {
    Curl_freeaddrinfo(addr);
    return NULL;
  }

  /* Create an entry id, based upon the hostname and port */
  entry_len = create_dnscache_id(hostname, hostlen, port,
                                 entry_id, sizeof(entry_id));

  dns->refcount = 1; /* the cache has the first reference */
  dns->addr = addr; /* this is the address(es) */
  if(permanent)
    dns->timestamp = 0; /* an entry that never goes stale */
  else {
    dns->timestamp = time(NULL);
    if(dns->timestamp == 0)
      dns->timestamp = 1;
  }
  dns->hostport = port;
  if(hostlen)
    memcpy(dns->hostname, hostname, hostlen);

  /* Store the resolved data in our DNS cache. */
  dns2 = Curl_hash_add(&dnscache->entries, entry_id, entry_len + 1,
                       (void *)dns);
  if(!dns2) {
    dnscache_entry_free(dns);
    return NULL;
  }

  dns = dns2;
  dns->refcount++;         /* mark entry as in-use */
  return dns;
}